

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_toggle.c
# Opt level: O0

void toggle_save(t_gobj *z,_binbuf *b)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  t_symbol *ptVar9;
  t_symbol *ptVar10;
  t_symbol *ptVar11;
  float local_fc;
  t_symbol *local_88;
  t_symbol *srl [3];
  t_symbol *local_68;
  t_symbol *bflcol [3];
  t_toggle *x;
  _binbuf *b_local;
  t_gobj *z_local;
  
  iemgui_save((t_iemgui *)z,&local_88,&local_68);
  ptVar9 = gensym("#X");
  ptVar10 = gensym("obj");
  sVar1 = *(short *)&z[2].g_next;
  sVar2 = *(short *)((long)&z[2].g_next + 2);
  ptVar11 = gensym("tgl");
  iVar3 = *(int *)((long)&z[4].g_pd + 4);
  iVar4 = *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4);
  iVar7 = iem_symargstoint((t_iem_init_symargs *)&z[0x44].g_next);
  uVar5 = *(undefined4 *)&z[5].g_pd;
  uVar6 = *(undefined4 *)((long)&z[5].g_pd + 4);
  iVar8 = iem_fstyletoint((t_iem_fstyle_flags *)(z + 0x44));
  if (((ulong)z[0x44].g_next & 1) == 0) {
    local_fc = 0.0;
  }
  else {
    local_fc = *(float *)&z[0x49].g_pd;
  }
  binbuf_addv(b,"ssiisiisssiiiisssff",(double)local_fc,(double)*(float *)((long)&z[0x49].g_pd + 4),
              ptVar9,ptVar10,(ulong)(uint)(int)sVar1,(ulong)(uint)(int)sVar2,ptVar11,iVar3 / iVar4,
              iVar7,local_88,srl[0],srl[1],uVar5,uVar6,iVar8,
              *(undefined4 *)((long)&z[0x44].g_pd + 4),local_68,bflcol[0],bflcol[1]);
  binbuf_addv(b,";");
  return;
}

Assistant:

static void toggle_save(t_gobj *z, t_binbuf *b)
{
    t_toggle *x = (t_toggle *)z;
    t_symbol *bflcol[3];
    t_symbol *srl[3];

    iemgui_save(&x->x_gui, srl, bflcol);
    binbuf_addv(b, "ssiisiisssiiiisssff", gensym("#X"), gensym("obj"),
                (int)x->x_gui.x_obj.te_xpix,
                (int)x->x_gui.x_obj.te_ypix,
                gensym("tgl"), x->x_gui.x_w/IEMGUI_ZOOM(x),
                iem_symargstoint(&x->x_gui.x_isa),
                srl[0], srl[1], srl[2],
                x->x_gui.x_ldx, x->x_gui.x_ldy,
                iem_fstyletoint(&x->x_gui.x_fsf), x->x_gui.x_fontsize,
                bflcol[0], bflcol[1], bflcol[2],
                x->x_gui.x_isa.x_loadinit?x->x_on:0.f,
                x->x_nonzero);
    binbuf_addv(b, ";");
}